

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveConditional.cpp
# Opt level: O1

void __thiscall
CDirectiveConditional::CDirectiveConditional(CDirectiveConditional *this,ConditionType type)

{
  CAssemblerCommand::CAssemblerCommand(&this->super_CAssemblerCommand);
  (this->super_CAssemblerCommand)._vptr_CAssemblerCommand =
       (_func_int **)&PTR__CDirectiveConditional_001cbb78;
  (this->expression).expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->expression).expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->expression).constExpression = true;
  (this->label).super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->label).super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->ifBlock)._M_t.
  super___uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>._M_t.
  super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
  super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl = (CAssemblerCommand *)0x0;
  (this->elseBlock)._M_t.
  super___uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>._M_t.
  super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
  super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl = (CAssemblerCommand *)0x0;
  this->type = type;
  this->previousResult = false;
  return;
}

Assistant:

CDirectiveConditional::CDirectiveConditional(ConditionType type)
{
	this->type = type;

	ifBlock = nullptr;
	elseBlock = nullptr;
	previousResult = false;
}